

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void __thiscall
density::
lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::commit(consume_operation *this)

{
  bool bVar1;
  InstanceCounted *this_00;
  void *i_dest;
  
  bVar1 = detail::
          LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty((Consume *)this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x3a7);
  }
  this_00 = (InstanceCounted *)complete_type(this);
  i_dest = element_ptr(this);
  runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>
  ::destroy((runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>
             *)this_00,i_dest);
  density_tests::InstanceCounted::~InstanceCounted(this_00);
  LOCK();
  **(undefined8 **)(this + 8) = *(undefined8 *)(this + 0x10);
  UNLOCK();
  detail::
  LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  ::Consume::clean_dead_elements((Consume *)this);
  *(undefined8 *)(this + 0x10) = 0;
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());

                auto const & type    = complete_type();
                auto const   element = element_ptr();
                type.destroy(element);

                type.RUNTIME_TYPE::~RUNTIME_TYPE();

                m_consume_data.commit_consume_impl();
            }